

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

void ghc::filesystem::path::postprocess_path_with_format(impl_string_type *p,format fmt)

{
  ulong uVar1;
  char *pcVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  undefined8 local_90;
  undefined8 local_88 [2];
  undefined8 local_78;
  undefined8 local_70;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  iterator new_end_1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  undefined8 local_50;
  undefined8 local_48 [2];
  undefined8 local_38;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  char *local_28;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  iterator new_end;
  format fmt_local;
  impl_string_type *p_local;
  
  new_end._M_current._4_4_ = fmt;
  uVar1 = std::__cxx11::string::length();
  if ((((uVar1 < 3) || (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)p), *pcVar2 != '/')
       ) || (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)p), *pcVar2 != '/')) ||
     (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)p), *pcVar2 == '/')) {
    local_70 = std::__cxx11::string::begin();
    local_78 = std::__cxx11::string::end();
    local_68 = std::
               unique<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,ghc::filesystem::path::postprocess_path_with_format(std::__cxx11::string&,ghc::filesystem::path::format)::__1>
                         (local_70,local_78);
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)local_88,&local_68);
    local_98._M_current = (char *)std::__cxx11::string::end();
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_90,&local_98);
    std::__cxx11::string::erase(p,local_88[0],local_90);
  }
  else {
    local_30._M_current = (char *)std::__cxx11::string::begin();
    local_28 = (char *)__gnu_cxx::
                       __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator+(&local_30,2);
    local_38 = std::__cxx11::string::end();
    local_20 = std::
               unique<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,ghc::filesystem::path::postprocess_path_with_format(std::__cxx11::string&,ghc::filesystem::path::format)::__0>
                         (local_28,local_38);
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)local_48,&local_20);
    local_58._M_current = (char *)std::__cxx11::string::end();
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_50,&local_58);
    std::__cxx11::string::erase(p,local_48[0],local_50);
  }
  return;
}

Assistant:

GHC_INLINE void path::postprocess_path_with_format(path::impl_string_type& p, path::format fmt)
{
#ifdef GHC_RAISE_UNICODE_ERRORS
    if(!detail::validUtf8(p)) {
        path t;
        t._path = p;
        throw filesystem_error("Illegal byte sequence for unicode character.", t, std::make_error_code(std::errc::illegal_byte_sequence));
    }
#endif
    switch (fmt) {
#ifndef GHC_OS_WINDOWS
        case path::auto_format:
        case path::native_format:
#endif
        case path::generic_format:
            // nothing to do
            break;
#ifdef GHC_OS_WINDOWS
        case path::auto_format:
        case path::native_format:
            if (detail::startsWith(p, std::string("\\\\?\\"))) {
                // remove Windows long filename marker
                p.erase(0, 4);
                if (detail::startsWith(p, std::string("UNC\\"))) {
                    p.erase(0, 2);
                    p[0] = '\\';
                }
            }
            for (auto& c : p) {
                if (c == '\\') {
                    c = '/';
                }
            }
            break;
#endif
    }
    if (p.length() > 2 && p[0] == '/' && p[1] == '/' && p[2] != '/') {
        std::string::iterator new_end = std::unique(p.begin() + 2, p.end(), [](path::value_type lhs, path::value_type rhs) { return lhs == rhs && lhs == '/'; });
        p.erase(new_end, p.end());
    }
    else {
        std::string::iterator new_end = std::unique(p.begin(), p.end(), [](path::value_type lhs, path::value_type rhs) { return lhs == rhs && lhs == '/'; });
        p.erase(new_end, p.end());
    }
}